

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O3

Type * slang::ast::PackedArrayType::fromSyntax
                 (Scope *scope,Type *elementType,EvaluatedDimension *dimension,SyntaxNode *syntax)

{
  SymbolKind SVar1;
  Compilation *this;
  DeferredSourceRange sourceRange;
  bool bVar2;
  Type *pTVar3;
  Diagnostic *diag;
  DPIOpenArrayType *pDVar4;
  SourceRange sourceRange_00;
  bool local_49 [17];
  SyntaxNode *local_38;
  
  this = scope->compilation;
  pTVar3 = elementType->canonical;
  if (pTVar3 == (Type *)0x0) {
    Type::resolveCanonical(elementType);
    pTVar3 = elementType->canonical;
  }
  if ((pTVar3->super_Symbol).kind == ErrorType) {
    return elementType;
  }
  bVar2 = Type::isIntegral(elementType);
  if (bVar2) {
    if (dimension->kind - Range < 2) {
      local_49[1] = false;
      local_49[2] = false;
      local_49[3] = false;
      local_49[4] = false;
      local_49[5] = false;
      local_49[6] = false;
      local_49[7] = false;
      local_49[8] = false;
      local_49[9] = false;
      local_49[10] = false;
      local_49[0xb] = false;
      local_49[0xc] = false;
      local_49[0xd] = false;
      local_49[0xe] = false;
      local_49[0xf] = false;
      local_49[0x10] = false;
      sourceRange.node.value = (uintptr_t)syntax;
      sourceRange.range = (SourceRange)ZEXT816(0);
      local_38 = syntax;
      pTVar3 = fromDim(scope,elementType,dimension->range,sourceRange);
      return pTVar3;
    }
    if (dimension->kind != DPIOpenArray) goto LAB_0031bad2;
    pTVar3 = elementType->canonical;
    if (pTVar3 == (Type *)0x0) {
      Type::resolveCanonical(elementType);
      pTVar3 = elementType->canonical;
    }
    if ((pTVar3->super_Symbol).kind != PackedArrayType) {
      local_49[0] = true;
      pDVar4 = BumpAllocator::emplace<slang::ast::DPIOpenArrayType,slang::ast::Type_const&,bool>
                         (&this->super_BumpAllocator,elementType,local_49);
      (pDVar4->super_Type).super_Symbol.originatingSyntax = syntax;
      return &pDVar4->super_Type;
    }
    sourceRange_00 = slang::syntax::SyntaxNode::sourceRange(syntax);
  }
  else {
    pTVar3 = elementType->canonical;
    if (pTVar3 == (Type *)0x0) {
      Type::resolveCanonical(elementType);
      pTVar3 = elementType->canonical;
    }
    SVar1 = (pTVar3->super_Symbol).kind;
    sourceRange_00 = slang::syntax::SyntaxNode::sourceRange(syntax);
    if (SVar1 != DPIOpenArrayType) {
      diag = Scope::addDiag(scope,(DiagCode)0x190009,sourceRange_00);
      ast::operator<<(diag,elementType);
      goto LAB_0031bad2;
    }
  }
  Scope::addDiag(scope,(DiagCode)0x110009,sourceRange_00);
LAB_0031bad2:
  return this->errorType;
}

Assistant:

const Type& PackedArrayType::fromSyntax(const Scope& scope, const Type& elementType,
                                        const EvaluatedDimension& dimension,
                                        const SyntaxNode& syntax) {
    auto& comp = scope.getCompilation();
    if (elementType.isError())
        return elementType;

    if (!elementType.isIntegral()) {
        if (elementType.getCanonicalType().kind == SymbolKind::DPIOpenArrayType)
            scope.addDiag(diag::MultiplePackedOpenArrays, syntax.sourceRange());
        else
            scope.addDiag(diag::PackedArrayNotIntegral, syntax.sourceRange()) << elementType;
        return comp.getErrorType();
    }

    if (!dimension.isRange()) {
        if (dimension.kind == DimensionKind::DPIOpenArray) {
            if (elementType.isPackedArray()) {
                scope.addDiag(diag::MultiplePackedOpenArrays, syntax.sourceRange());
                return comp.getErrorType();
            }

            auto result = comp.emplace<DPIOpenArrayType>(elementType, /* isPacked */ true);
            result->setSyntax(syntax);
            return *result;
        }
        return comp.getErrorType();
    }

    return fromDim(scope, elementType, dimension.range, syntax);
}